

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

optional<spv::Capability>
spvtools::opt::Handler_OpImageRead_StorageImageReadWithoutFormat(Instruction *instruction)

{
  Op OVar1;
  IRContext *this;
  Instruction *this_00;
  Capability local_40;
  undefined1 local_3a;
  undefined1 local_39;
  uint32_t local_38;
  bool requires_capability_for_unknown;
  uint32_t uStack_34;
  bool is_unknown;
  uint32_t format;
  uint32_t dim;
  Instruction *type;
  uint32_t type_index;
  uint32_t image_index;
  DefUseManager *def_use_mgr;
  Instruction *instruction_local;
  
  def_use_mgr = (DefUseManager *)instruction;
  OVar1 = Instruction::opcode(instruction);
  if (OVar1 != OpImageRead) {
    __assert_fail("instruction->opcode() == spv::Op::OpImageRead && \"This handler only support OpImageRead opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0x14c,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpImageRead_StorageImageReadWithoutFormat(const Instruction *)"
                 );
  }
  this = Instruction::context((Instruction *)def_use_mgr);
  _type_index = IRContext::get_def_use_mgr(this);
  type._4_4_ = Instruction::GetSingleWordInOperand((Instruction *)def_use_mgr,0);
  this_00 = analysis::DefUseManager::GetDef(_type_index,type._4_4_);
  type._0_4_ = Instruction::type_id(this_00);
  _format = analysis::DefUseManager::GetDef(_type_index,(uint32_t)type);
  uStack_34 = Instruction::GetSingleWordInOperand(_format,1);
  local_38 = Instruction::GetSingleWordInOperand(_format,6);
  local_39 = local_38 == 0;
  local_3a = uStack_34 != 6;
  if (((bool)local_39) && ((bool)local_3a)) {
    local_40 = CapabilityStorageImageReadWithoutFormat;
    std::optional<spv::Capability>::optional<spv::Capability,_true>
              ((optional<spv::Capability> *)&instruction_local,&local_40);
  }
  else {
    std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
  }
  return (_Optional_base<spv::Capability,_true,_true>)
         (_Optional_base<spv::Capability,_true,_true>)instruction_local;
}

Assistant:

static std::optional<spv::Capability>
Handler_OpImageRead_StorageImageReadWithoutFormat(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpImageRead &&
         "This handler only support OpImageRead opcodes.");
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  const uint32_t image_index =
      instruction->GetSingleWordInOperand(kOpImageReadImageIndex);
  const uint32_t type_index = def_use_mgr->GetDef(image_index)->type_id();
  const Instruction* type = def_use_mgr->GetDef(type_index);
  const uint32_t dim = type->GetSingleWordInOperand(kOpTypeImageDimIndex);
  const uint32_t format = type->GetSingleWordInOperand(kOpTypeImageFormatIndex);

  // If the Image Format is Unknown and Dim is SubpassData,
  // StorageImageReadWithoutFormat is required.
  const bool is_unknown = spv::ImageFormat(format) == spv::ImageFormat::Unknown;
  const bool requires_capability_for_unknown =
      spv::Dim(dim) != spv::Dim::SubpassData;
  return is_unknown && requires_capability_for_unknown
             ? std::optional(spv::Capability::StorageImageReadWithoutFormat)
             : std::nullopt;
}